

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int rank;
  int p;
  int local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  MPI_Comm_size(&ompi_mpi_comm_world,local_20);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_24);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hello from ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
  std::endl<char,std::char_traits<char>>(poVar1);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int p, rank;

  MPI_Init(&argc, &argv);
  MPI_Comm_size(MPI_COMM_WORLD, &p);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);

  std::cout << "Hello from " << rank << std::endl; 

  MPI_Finalize();

  return 0;
}